

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_printer_n.c
# Opt level: O0

void dump_ast_node_list(TextBuffer *buf,AstNodeList *list,int level,char *delimiter)

{
  undefined1 local_50 [8];
  PtrListIterator nodeiter__;
  AstNode *pAStack_30;
  _Bool is_first;
  AstNode *node;
  char *delimiter_local;
  int level_local;
  AstNodeList *list_local;
  TextBuffer *buf_local;
  
  nodeiter__._23_1_ = 1;
  raviX_ptrlist_forward_iterator((PtrListIterator *)local_50,(PtrList *)list);
  pAStack_30 = (AstNode *)raviX_ptrlist_iter_next((PtrListIterator *)local_50);
  while (pAStack_30 != (AstNode *)0x0) {
    if ((nodeiter__._23_1_ & 1) == 0) {
      if (delimiter != (char *)0x0) {
        printf_buf(buf,"%p%s\n",(ulong)(uint)level,delimiter);
      }
    }
    else {
      nodeiter__._23_1_ = 0;
    }
    raviX_dump_ast_node(buf,pAStack_30,level + 1);
    pAStack_30 = (AstNode *)raviX_ptrlist_iter_next((PtrListIterator *)local_50);
  }
  return;
}

Assistant:

static void dump_ast_node_list(TextBuffer *buf, AstNodeList *list, int level, const char *delimiter)
{
	AstNode *node;
	bool is_first = true;
	FOR_EACH_PTR(list, AstNode, node)
	{
		if (is_first)
			is_first = false;
		else if (delimiter)
			printf_buf(buf, "%p%s\n", level, delimiter);
		raviX_dump_ast_node(buf, node, level + 1);
	}
	END_FOR_EACH_PTR(node)
}